

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestCommand.h
# Opt level: O1

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestTestCommand::Clone(cmCTestTestCommand *this)

{
  _func_int **__s;
  long in_RSI;
  
  __s = (_func_int **)operator_new(0x380);
  memset(__s,0,0x380);
  *__s = (_func_int *)&PTR__cmCTestHandlerCommand_0095f178;
  __s[0x13] = (_func_int *)0x0;
  __s[0x14] = (_func_int *)0x0;
  *(undefined8 *)((long)__s + 0xa2) = 0;
  *(undefined8 *)((long)__s + 0xaa) = 0;
  __s[0x17] = (_func_int *)(__s + 0x19);
  __s[0x18] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x19) = 0;
  __s[0x1b] = (_func_int *)(__s + 0x1d);
  __s[0x1c] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x1d) = 0;
  __s[0x1f] = (_func_int *)(__s + 0x21);
  __s[0x20] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x21) = 0;
  __s[0x23] = (_func_int *)(__s + 0x25);
  __s[0x24] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x25) = 0;
  __s[0x27] = (_func_int *)(__s + 0x29);
  __s[0x28] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x29) = 0;
  *__s = (_func_int *)&PTR__cmCTestTestCommand_0095e0a8;
  __s[0x2b] = (_func_int *)(__s + 0x2d);
  __s[0x2c] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x2d) = 0;
  __s[0x2f] = (_func_int *)(__s + 0x31);
  __s[0x30] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x31) = 0;
  __s[0x33] = (_func_int *)(__s + 0x35);
  __s[0x34] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x35) = 0;
  __s[0x37] = (_func_int *)(__s + 0x39);
  __s[0x38] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x39) = 0;
  __s[0x3b] = (_func_int *)(__s + 0x3d);
  __s[0x3c] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x3d) = 0;
  __s[0x3f] = (_func_int *)(__s + 0x41);
  __s[0x40] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x41) = 0;
  __s[0x43] = (_func_int *)(__s + 0x45);
  __s[0x44] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x45) = 0;
  __s[0x47] = (_func_int *)(__s + 0x49);
  __s[0x48] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x49) = 0;
  __s[0x4b] = (_func_int *)(__s + 0x4d);
  __s[0x4c] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x4d) = 0;
  __s[0x4f] = (_func_int *)(__s + 0x51);
  __s[0x50] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x51) = 0;
  __s[0x53] = (_func_int *)(__s + 0x55);
  __s[0x54] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x55) = 0;
  __s[0x57] = (_func_int *)(__s + 0x59);
  __s[0x58] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x59) = 0;
  __s[0x5b] = (_func_int *)(__s + 0x5d);
  __s[0x5c] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x5d) = 0;
  __s[0x5f] = (_func_int *)(__s + 0x61);
  __s[0x60] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x61) = 0;
  __s[99] = (_func_int *)(__s + 0x65);
  __s[100] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x65) = 0;
  __s[0x67] = (_func_int *)(__s + 0x69);
  __s[0x68] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x69) = 0;
  __s[0x6b] = (_func_int *)(__s + 0x6d);
  __s[0x6c] = (_func_int *)0x0;
  *(undefined1 *)(__s + 0x6d) = 0;
  *(undefined1 *)(__s + 0x6f) = 0;
  __s[3] = *(_func_int **)(in_RSI + 0x18);
  __s[4] = *(_func_int **)(in_RSI + 0x20);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand = __s;
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> Clone() override
  {
    auto ni = cm::make_unique<cmCTestTestCommand>();
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return std::unique_ptr<cmCommand>(std::move(ni));
  }